

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O2

void xml_skip_whitespace(xml_parser *parser)

{
  ushort *puVar1;
  ushort **ppuVar2;
  ulong uVar3;
  ulong uVar4;
  
  ppuVar2 = __ctype_b_loc();
  puVar1 = *ppuVar2;
  uVar4 = parser->position;
  while ((uVar3 = uVar4 + 1,
         (*(byte *)((long)puVar1 + (ulong)parser->buffer[uVar4] * 2 + 1) & 0x20) != 0 &&
         (uVar3 < parser->length))) {
    parser->position = uVar3;
    uVar4 = uVar3;
  }
  return;
}

Assistant:

static void xml_skip_whitespace(struct xml_parser* parser) {
	xml_parser_info(parser, "whitespace");

	while (isspace(parser->buffer[parser->position])) {
		if (parser->position + 1 >= parser->length) {
			return;
		} else {
			parser->position++;
		}
	}
}